

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
Rml::Context::Context
          (Context *this,String *name,RenderManager *render_manager,
          TextInputHandler *text_input_handler)

{
  code *pcVar1;
  ElementDocument *pEVar2;
  bool bVar3;
  pointer pEVar4;
  unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_> local_3c8;
  pointer local_3c0;
  Property local_3b8;
  Property local_368;
  Property local_318;
  Property local_2c8;
  Property local_278;
  Property local_228;
  Property local_1d8;
  Colour<unsigned_char,_255,_false> local_184;
  Property local_180;
  ElementDocument *local_130;
  ElementDocument *cursor_proxy_document;
  pointer ppStack_120;
  pointer local_118;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_108;
  Property local_100;
  Vector2f local_b0;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_a8;
  allocator<char> local_89;
  String local_88;
  allocator<char> local_61;
  String local_60;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_40;
  allocator<char> local_35 [13];
  TextInputHandler *local_28;
  TextInputHandler *text_input_handler_local;
  RenderManager *render_manager_local;
  String *name_local;
  Context *this_local;
  
  local_28 = text_input_handler;
  text_input_handler_local = (TextInputHandler *)render_manager;
  render_manager_local = (RenderManager *)name;
  name_local = (String *)this;
  ScriptInterface::ScriptInterface(&this->super_ScriptInterface);
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Context_00814dd8;
  ::std::__cxx11::string::string((string *)&this->name,(string *)render_manager_local);
  Vector2<int>::Vector2(&this->dimensions);
  this->density_independent_pixel_ratio = 1.0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->documents_base_tag,"body",local_35);
  ::std::allocator<char>::~allocator(local_35);
  this->render_manager = (RenderManager *)text_input_handler_local;
  itlib::
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_set(&this->active_themes);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::flat_set(&this->hover_chain);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::vector(&this->active_chain);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::vector
            (&this->document_focus_history);
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::vector(&this->unloaded_documents);
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)&this->root);
  Vector2<int>::Vector2(&this->last_click_mouse_position);
  Vector2<int>::Vector2(&this->mouse_position);
  ::std::unique_ptr<Rml::ScrollController,std::default_delete<Rml::ScrollController>>::
  unique_ptr<std::default_delete<Rml::ScrollController>,void>
            ((unique_ptr<Rml::ScrollController,std::default_delete<Rml::ScrollController>> *)
             &this->scroll_controller);
  ::std::__cxx11::string::string((string *)&this->cursor_name);
  ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
  unique_ptr<Rml::Releaser<Rml::Element>,void>
            ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)&this->cursor_proxy);
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::flat_set(&this->drag_hover_chain);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->data_models);
  ::std::unique_ptr<Rml::DataTypeRegister,std::default_delete<Rml::DataTypeRegister>>::
  unique_ptr<std::default_delete<Rml::DataTypeRegister>,void>
            ((unique_ptr<Rml::DataTypeRegister,std::default_delete<Rml::DataTypeRegister>> *)
             &this->default_data_type_register);
  this->text_input_handler = local_28;
  this->next_update_timeout = 0.0;
  this->instancer = (ContextInstancer *)0x0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"*",&local_61);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"#root",&local_89);
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_a8);
  Factory::InstanceElement((Factory *)&local_40,(Element *)0x0,&local_60,&local_88,&local_a8);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator=(&this->root,&local_40);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_40);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
  Element::SetId(pEVar4,(String *)render_manager_local);
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
  Vector2<float>::Vector2(&local_b0,0.0,0.0);
  Element::SetOffset(pEVar4,local_b0,(Element *)0x0,false);
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
  Property::Property<int>(&local_100,0,NUMBER,-1);
  Element::SetProperty(pEVar4,ZIndex,&local_100);
  Property::~Property(&local_100);
  cursor_proxy_document = (ElementDocument *)0x0;
  ppStack_120 = (pointer)0x0;
  local_118 = (pointer)0x0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)&cursor_proxy_document);
  Factory::InstanceElement
            ((Factory *)&local_108,(Element *)0x0,&this->documents_base_tag,
             &this->documents_base_tag,
             (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)&cursor_proxy_document);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator=
            (&this->cursor_proxy,&local_108);
  ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_108);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)&cursor_proxy_document);
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->cursor_proxy);
  local_130 = rmlui_dynamic_cast<Rml::ElementDocument*,Rml::Element*>(pEVar4);
  if ((local_130 == (ElementDocument *)0x0) &&
     (bVar3 = Assert("RMLUI_ASSERT(cursor_proxy_document)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                     ,0x45), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pEVar2 = local_130;
  local_130->context = this;
  Colour<unsigned_char,_255,_false>::Colour(&local_184,0xff,0xff,0xff,'\0');
  Property::Property<Rml::Colour<unsigned_char,255,false>>(&local_180,local_184,COLOUR,-1);
  Element::SetProperty(&pEVar2->super_Element,BackgroundColor,&local_180);
  Property::~Property(&local_180);
  pEVar2 = local_130;
  Property::Property<int>(&local_1d8,0,PX,-1);
  Element::SetProperty(&pEVar2->super_Element,BorderTopWidth,&local_1d8);
  Property::~Property(&local_1d8);
  pEVar2 = local_130;
  Property::Property<int>(&local_228,0,PX,-1);
  Element::SetProperty(&pEVar2->super_Element,BorderRightWidth,&local_228);
  Property::~Property(&local_228);
  pEVar2 = local_130;
  Property::Property<int>(&local_278,0,PX,-1);
  Element::SetProperty(&pEVar2->super_Element,BorderBottomWidth,&local_278);
  Property::~Property(&local_278);
  pEVar2 = local_130;
  Property::Property<int>(&local_2c8,0,PX,-1);
  Element::SetProperty(&pEVar2->super_Element,BorderLeftWidth,&local_2c8);
  Property::~Property(&local_2c8);
  pEVar2 = local_130;
  Property::Property(&local_318);
  Element::SetProperty(&pEVar2->super_Element,Decorator,&local_318);
  Property::~Property(&local_318);
  pEVar2 = local_130;
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&local_368,Visible);
  Element::SetProperty(&pEVar2->super_Element,OverflowX,&local_368);
  Property::~Property(&local_368);
  pEVar2 = local_130;
  Property::Property<Rml::Style::Overflow,Rml::Style::Overflow>(&local_3b8,Visible);
  Element::SetProperty(&pEVar2->super_Element,OverflowY,&local_3b8);
  Property::~Property(&local_3b8);
  local_3c0 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
  ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::push_back
            (&this->document_focus_history,&local_3c0);
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(&this->root);
  this->focus = pEVar4;
  this->hover = (Element *)0x0;
  this->active = (Element *)0x0;
  this->drag = (Element *)0x0;
  this->drag_started = false;
  this->drag_verbose = false;
  this->drag_clone = (Element *)0x0;
  this->drag_hover = (Element *)0x0;
  this->last_click_element = (Element *)0x0;
  this->last_click_time = 0.0;
  this->mouse_active = false;
  this->enable_cursor = true;
  MakeUnique<Rml::ScrollController>();
  ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::operator=
            (&this->scroll_controller,&local_3c8);
  ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::~unique_ptr
            (&local_3c8);
  return;
}

Assistant:

Context::Context(const String& name, RenderManager* render_manager, TextInputHandler* text_input_handler) :
	name(name), render_manager(render_manager), text_input_handler(text_input_handler)
{
	instancer = nullptr;

	root = Factory::InstanceElement(nullptr, "*", "#root", XMLAttributes());
	root->SetId(name);
	root->SetOffset(Vector2f(0, 0), nullptr);
	root->SetProperty(PropertyId::ZIndex, Property(0, Unit::NUMBER));

	cursor_proxy = Factory::InstanceElement(nullptr, documents_base_tag, documents_base_tag, XMLAttributes());
	ElementDocument* cursor_proxy_document = rmlui_dynamic_cast<ElementDocument*>(cursor_proxy.get());
	RMLUI_ASSERT(cursor_proxy_document);
	cursor_proxy_document->context = this;

	// The cursor proxy takes the style from its cloned element's document. The latter may define style rules for `<body>` which we don't want on the
	// proxy. Thus, we override some properties here that we in particular don't want to inherit from the client document, especially those that
	// result in decoration of the body element.
	cursor_proxy_document->SetProperty(PropertyId::BackgroundColor, Property(Colourb(255, 255, 255, 0), Unit::COLOUR));
	cursor_proxy_document->SetProperty(PropertyId::BorderTopWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderRightWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderBottomWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::BorderLeftWidth, Property(0, Unit::PX));
	cursor_proxy_document->SetProperty(PropertyId::Decorator, Property());
	cursor_proxy_document->SetProperty(PropertyId::OverflowX, Property(Style::Overflow::Visible));
	cursor_proxy_document->SetProperty(PropertyId::OverflowY, Property(Style::Overflow::Visible));

	document_focus_history.push_back(root.get());
	focus = root.get();
	hover = nullptr;
	active = nullptr;
	drag = nullptr;

	drag_started = false;
	drag_verbose = false;
	drag_clone = nullptr;
	drag_hover = nullptr;
	last_click_element = nullptr;
	last_click_time = 0;

	mouse_active = false;
	enable_cursor = true;

	scroll_controller = MakeUnique<ScrollController>();
}